

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  element_type *peVar5;
  void *pvVar6;
  element_type *peVar7;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *this;
  __shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *__x;
  __shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  shared_ptr<Population> *population;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *__range1;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> populations;
  string local_188 [32];
  undefined1 local_168 [8];
  Player player;
  int kJ;
  int kI;
  Map map;
  allocator<char> local_101;
  string local_100 [32];
  undefined1 local_e0 [8];
  shared_ptr<Population> p;
  shared_ptr<HerbivorePopulationBuilder> local_c0;
  undefined1 local_b0 [8];
  shared_ptr<PopulationBuilder> b;
  PopulationDirector d;
  json waterCell;
  undefined1 local_70 [8];
  shared_ptr<CellTypeJSONRepresentationBuilder> jsonBuilder;
  shared_ptr<CellType> steppeCell;
  undefined1 local_30 [8];
  shared_ptr<CellTypeBuilder> builder;
  CellTypeDirector director;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"***Create cell example code***");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  CellTypeDirector::CellTypeDirector
            ((CellTypeDirector *)
             &builder.super___shared_ptr<CellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<CellTypeBuilder>();
  p_Var1 = &steppeCell.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<AbstractCellTypeBuilder>::shared_ptr<CellTypeBuilder,void>
            ((shared_ptr<AbstractCellTypeBuilder> *)p_Var1,(shared_ptr<CellTypeBuilder> *)local_30);
  CellTypeDirector::setBuilder
            (&builder.super___shared_ptr<CellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             p_Var1);
  std::shared_ptr<AbstractCellTypeBuilder>::~shared_ptr
            ((shared_ptr<AbstractCellTypeBuilder> *)
             &steppeCell.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  CellTypeDirector::makeSteppeCell();
  std::__shared_ptr_access<CellTypeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<CellTypeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  CellTypeBuilder::getProduct();
  peVar5 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &jsonBuilder.
                       super___shared_ptr<CellTypeJSONRepresentationBuilder,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  pvVar6 = (void *)operator<<((ostream *)&std::cout,peVar5);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  std::make_shared<CellTypeJSONRepresentationBuilder>();
  std::shared_ptr<AbstractCellTypeBuilder>::shared_ptr<CellTypeJSONRepresentationBuilder,void>
            ((shared_ptr<AbstractCellTypeBuilder> *)&waterCell.m_value,
             (shared_ptr<CellTypeJSONRepresentationBuilder> *)local_70);
  CellTypeDirector::setBuilder
            (&builder.super___shared_ptr<CellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &waterCell.m_value);
  std::shared_ptr<AbstractCellTypeBuilder>::~shared_ptr
            ((shared_ptr<AbstractCellTypeBuilder> *)&waterCell.m_value);
  CellTypeDirector::makeWaterCell();
  std::
  __shared_ptr_access<CellTypeJSONRepresentationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<CellTypeJSONRepresentationBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_70);
  CellTypeJSONRepresentationBuilder::getProduct_abi_cxx11_();
  poVar4 = nlohmann::operator<<
                     ((ostream *)&std::cout,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)&d.builder.
                          super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"***Create population example code***");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  PopulationDirector::PopulationDirector
            ((PopulationDirector *)
             &b.super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<HerbivorePopulationBuilder>();
  std::shared_ptr<PopulationBuilder>::shared_ptr<HerbivorePopulationBuilder,void>
            ((shared_ptr<PopulationBuilder> *)local_b0,&local_c0);
  std::shared_ptr<HerbivorePopulationBuilder>::~shared_ptr(&local_c0);
  p_Var1 = &p.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<PopulationBuilder>::shared_ptr
            ((shared_ptr<PopulationBuilder> *)p_Var1,(shared_ptr<PopulationBuilder> *)local_b0);
  PopulationDirector::setBuilder
            (&b.super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount,p_Var1
            );
  std::shared_ptr<PopulationBuilder>::~shared_ptr
            ((shared_ptr<PopulationBuilder> *)
             &p.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"elephant",&local_101);
  PopulationDirector::makeBig((string *)local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  peVar7 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_e0);
  operator<<((ostream *)&std::cout,(Population *)peVar7);
  poVar4 = std::operator<<((ostream *)&std::cout,"***Mutation example code***");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  peVar7 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_e0);
  Population::mutate((MutationType)peVar7);
  peVar7 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_e0);
  operator<<((ostream *)&std::cout,(Population *)peVar7);
  peVar7 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_e0);
  Population::mutate((MutationType)peVar7);
  peVar7 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_e0);
  operator<<((ostream *)&std::cout,(Population *)peVar7);
  poVar4 = std::operator<<((ostream *)&std::cout,"***Generate map example code***");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Map::Map((Map *)&kJ,10,10);
  Map::generate();
  for (player._60_4_ = 0; (int)player._60_4_ < 10; player._60_4_ = player._60_4_ + 1) {
    for (player.id = 0; player.id < 10; player.id = player.id + 1) {
      this = (vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *)
             Map::operator[]((ulong)&kJ);
      this_00 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](this,(long)player.id);
      std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (this_00);
      iVar3 = CellType::getType();
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::operator<<(poVar4," ");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"***Generate player example code***");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Player::Player((Player *)local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_188,"Cat",
             (allocator<char> *)
             ((long)&populations.
                     super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Player::SetName((string *)local_168);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&populations.
                     super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Player::generatePopulations();
  __x = (vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *)
        Player::GetPlayerPopulations();
  std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::vector
            ((vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *)
             &__range1,__x);
  __end1 = std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::
           begin((vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                  *)&__range1);
  population = (shared_ptr<Population> *)
               std::
               vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::
               end((vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                    *)&__range1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
                                *)&population);
    if (!bVar2) break;
    this_01 = (__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
              ::operator*(&__end1);
    peVar7 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(this_01);
    pvVar6 = (void *)operator<<((ostream *)&std::cout,(Population *)peVar7);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::~vector
            ((vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *)
             &__range1);
  Player::~Player((Player *)local_168);
  Map::~Map((Map *)&kJ);
  std::shared_ptr<Population>::~shared_ptr((shared_ptr<Population> *)local_e0);
  std::shared_ptr<PopulationBuilder>::~shared_ptr((shared_ptr<PopulationBuilder> *)local_b0);
  PopulationDirector::~PopulationDirector
            ((PopulationDirector *)
             &b.super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&d.builder.super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  std::shared_ptr<CellTypeJSONRepresentationBuilder>::~shared_ptr
            ((shared_ptr<CellTypeJSONRepresentationBuilder> *)local_70);
  std::shared_ptr<CellType>::~shared_ptr
            ((shared_ptr<CellType> *)
             &jsonBuilder.
              super___shared_ptr<CellTypeJSONRepresentationBuilder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<CellTypeBuilder>::~shared_ptr((shared_ptr<CellTypeBuilder> *)local_30);
  CellTypeDirector::~CellTypeDirector
            ((CellTypeDirector *)
             &builder.super___shared_ptr<CellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main() {
  std::cout << "***Create cell example code***" << std:: endl;

  CellTypeDirector director;

  auto builder = std::make_shared<CellTypeBuilder>();
  director.setBuilder(builder);
  director.makeSteppeCell();
  std::shared_ptr<CellType> steppeCell = builder -> getProduct();
  std::cout << *steppeCell << std::endl;

  auto jsonBuilder = std::make_shared<CellTypeJSONRepresentationBuilder>();
  director.setBuilder(jsonBuilder);
  director.makeWaterCell();
  auto waterCell = jsonBuilder -> getProduct();
  std::cout << waterCell << std::endl;


  std::cout << "***Create population example code***" << std:: endl;
  PopulationDirector d;
  std::shared_ptr<PopulationBuilder> b = std::make_shared<HerbivorePopulationBuilder>();
  d.setBuilder(b);
  std::shared_ptr<Population> p = d.makeBig("elephant");
  std::cout << *p;

  std::cout << "***Mutation example code***" << std::endl;
  p->mutate(Population::MutationType::VELOCITY);
  std::cout << *p;
  p->mutate(Population::MutationType::SIZE);
  std::cout << *p;

  std::cout << "***Generate map example code***" << std::endl;
  Map map(10, 10);
  map.generate();
  for (int kI = 0; kI < 10; ++kI) {
    for (int kJ = 0; kJ < 10; ++kJ) {
      std::cout << map[kI][kJ] -> getType() << " ";
    }
    std::cout << std::endl;
  }

  std::cout << "***Generate player example code***" << std::endl;
  Player player;
  player.SetName("Cat");
  player.generatePopulations();
  auto populations = player.GetPlayerPopulations();
  for (auto &population : populations) {
    std::cout << *population << std::endl;
  }

  return 0;
}